

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ResolveImage
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,Image *img,
          ConversionData *conv_data)

{
  MapType MVar1;
  uint index;
  StreamReader<true,_true> *pSVar2;
  int8_t *__src;
  bool bVar3;
  _Alloc_hider _Var4;
  char cVar5;
  int iVar6;
  aiTexture *paVar7;
  size_t sVar8;
  long lVar9;
  aiTexel *__dest;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  long lVar20;
  aiString name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  aiMaterial *local_860;
  long *local_858 [2];
  long local_848 [2];
  undefined1 local_838 [1028];
  aiString local_434;
  
  pcVar16 = local_434.data + 1;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(pcVar16,0x1b,0x3ff);
  if ((img->packedfile).super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    sVar8 = strlen(img->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_880,img->name,img->name + sVar8);
    _Var4._M_p = local_880._M_dataplus._M_p;
    sVar8 = 0x3ff;
    if ((local_880._M_string_length & 0xfffffc00) == 0) {
      sVar8 = local_880._M_string_length & 0xffffffff;
    }
    local_838._0_4_ = (uint)sVar8;
    memcpy(local_838 + 4,local_880._M_dataplus._M_p,sVar8);
    local_838[sVar8 + 4] = 0;
    local_434.length = (uint)sVar8;
    memcpy(local_434.data,local_838 + 4,sVar8);
    local_434.data[sVar8] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &local_880.field_2) {
      operator_delete(_Var4._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_434.data[0] = '*';
    uVar11 = (ulong)((long)(conv_data->textures).arr.
                           super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(conv_data->textures).arr.
                          super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
    local_434.length = 1;
    if ((int)uVar11 < 0) {
      pcVar16 = local_434.data + 2;
      local_434.data[1] = '-';
      uVar11 = (ulong)(uint)-(int)uVar11;
      local_434.length = 2;
    }
    iVar6 = 1000000000;
    bVar19 = false;
    do {
      if (0x3fe < local_434.length) break;
      uVar13 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
      lVar20 = (long)uVar13 / (long)iVar6;
      uVar13 = (long)uVar13 % (long)iVar6 & 0xffffffff;
      if (((bVar19) || (iVar6 == 1)) || ((int)lVar20 != 0)) {
        pcVar18 = pcVar16 + 1;
        local_434.length = local_434.length + 1;
        *pcVar16 = (char)lVar20 + '0';
        bVar19 = true;
        if (iVar6 != 1) goto LAB_0045b0ce;
        bVar3 = false;
        iVar6 = 1;
        uVar11 = uVar13;
        pcVar16 = pcVar18;
      }
      else {
        uVar13 = uVar11 & 0xffffffff;
        pcVar18 = pcVar16;
LAB_0045b0ce:
        iVar6 = iVar6 / 10;
        bVar3 = true;
        uVar11 = uVar13;
        pcVar16 = pcVar18;
      }
    } while (bVar3);
    *pcVar16 = '\0';
    local_860 = out;
    paVar7 = (aiTexture *)operator_new(0x428);
    paVar7->mWidth = 0;
    paVar7->mHeight = 0;
    paVar7->pcData = (aiTexel *)0x0;
    (paVar7->mFilename).length = 0;
    (paVar7->mFilename).data[0] = '\0';
    memset((paVar7->mFilename).data + 1,0x1b,0x3ff);
    paVar7->achFormatHint[0] = '\0';
    paVar7->achFormatHint[1] = '\0';
    paVar7->achFormatHint[2] = '\0';
    paVar7->achFormatHint[3] = '\0';
    local_838._0_8_ = paVar7;
    std::vector<aiTexture*,std::allocator<aiTexture*>>::emplace_back<aiTexture*>
              ((vector<aiTexture*,std::allocator<aiTexture*>> *)&conv_data->textures,
               (aiTexture **)local_838);
    paVar7 = (conv_data->textures).arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    pcVar16 = img->name;
    sVar8 = strlen(pcVar16);
    pcVar14 = img->name + sVar8;
    pcVar18 = pcVar14;
    if (-1 < (long)sVar8) {
      lVar20 = 0x428;
      if ((long)(sVar8 + 0x428) < 0x428) {
        lVar20 = sVar8 + 0x428;
      }
      lVar9 = sVar8 + 0x429;
      pcVar17 = pcVar14;
      do {
        pcVar18 = pcVar17;
        if (*pcVar17 == '.') break;
        pcVar17 = pcVar17 + -1;
        lVar9 = lVar9 + -1;
        pcVar18 = (img->id).name + lVar20 + -0x21;
      } while (0x428 < lVar9);
    }
    if (pcVar14 < pcVar18 + 1) {
      cVar5 = '\0';
    }
    else {
      iVar6 = tolower((int)pcVar18[1]);
      cVar5 = (char)iVar6;
    }
    paVar7->achFormatHint[0] = cVar5;
    if (pcVar14 < pcVar18 + 2) {
      cVar5 = '\0';
    }
    else {
      iVar6 = tolower((int)pcVar18[2]);
      cVar5 = (char)iVar6;
    }
    paVar7->achFormatHint[1] = cVar5;
    if (pcVar14 < pcVar18 + 3) {
      cVar5 = '\0';
    }
    else {
      iVar6 = tolower((int)pcVar18[3]);
      cVar5 = (char)iVar6;
    }
    paVar7->achFormatHint[2] = cVar5;
    paVar7->achFormatHint[3] = '\0';
    uVar15 = ((img->packedfile).
              super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             size;
    paVar7->mWidth = uVar15;
    __dest = (aiTexel *)operator_new__((ulong)uVar15);
    pSVar2 = (conv_data->db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    StreamReader<true,_true>::SetPtr
              (pSVar2,pSVar2->buffer +
                      ((((img->packedfile).
                         super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->data).
                       super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->val);
    pSVar2 = (conv_data->db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    uVar15 = paVar7->mWidth;
    __src = pSVar2->current;
    StreamReader<true,_true>::SetPtr(pSVar2,__src + uVar15);
    memcpy(__dest,__src,(ulong)uVar15);
    paVar7->pcData = __dest;
    local_858[0] = local_848;
    sVar8 = strlen(pcVar16);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_858,pcVar16,pcVar16 + sVar8);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_858,0,(char *)0x0,0x6c70f1);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_880.field_2._M_allocated_capacity = *psVar12;
      local_880.field_2._8_8_ = plVar10[3];
      local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    }
    else {
      local_880.field_2._M_allocated_capacity = *psVar12;
      local_880._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_880._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_838,
               &local_880);
    LogFunctions<Assimp::BlenderImporter>::LogInfo((format *)local_838);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
    std::ios_base::~ios_base((ios_base *)(local_838 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
    out = local_860;
    if (local_858[0] != local_848) {
      operator_delete(local_858[0],local_848[0] + 1);
    }
  }
  MVar1 = tex->mapto;
  uVar15 = 1;
  if ((MVar1 & MapType_COL) == 0) {
    if ((MVar1 & MapType_NORM) == 0) {
      uVar15 = 2;
      if ((((MVar1 & MapType_COLSPEC) == 0) && (uVar15 = 0xb, (MVar1 & MapType_COLMIR) == 0)) &&
         ((uVar15 = 7, (MVar1 & MapType_SPEC) == 0 &&
          ((uVar15 = 4, (MVar1 & MapType_EMIT) == 0 && (uVar15 = 3, (MVar1 >> 0xb & 1) == 0)))))) {
        uVar15 = (uint)((MVar1 >> 0xc & 1) == 0) * 9 + 9;
      }
    }
    else {
      uVar15 = ((((tex->tex).super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->imaflag >> 0xb & 1) != 0) + 5;
      aiMaterial::AddBinaryProperty(out,&tex->norfac,4,"$mat.bumpscaling",0,0,aiPTI_Float);
    }
  }
  index = conv_data->next_texture[uVar15];
  conv_data->next_texture[uVar15] = index + 1;
  aiMaterial::AddProperty(out,&local_434,"$tex.file",uVar15,index);
  return;
}

Assistant:

void BlenderImporter::ResolveImage(aiMaterial* out, const Material* mat, const MTex* tex, const Image* img, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;
    aiString name;

    // check if the file contents are bundled with the BLEND file
    if (img->packedfile) {
        name.data[0] = '*';
        name.length = 1+ ASSIMP_itoa10(name.data+1,static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(conv_data.textures->size()));

        conv_data.textures->push_back(new aiTexture());
        aiTexture* tex = conv_data.textures->back();

        // usually 'img->name' will be the original file name of the embedded textures,
        // so we can extract the file extension from it.
        const size_t nlen = strlen( img->name );
        const char* s = img->name+nlen, *e = s;
        while ( s >= img->name && *s != '.' ) {
            --s;
        }

        tex->achFormatHint[0] = s+1>e ? '\0' : ::tolower( s[1] );
        tex->achFormatHint[1] = s+2>e ? '\0' : ::tolower( s[2] );
        tex->achFormatHint[2] = s+3>e ? '\0' : ::tolower( s[3] );
        tex->achFormatHint[3] = '\0';

        // tex->mHeight = 0;
        tex->mWidth = img->packedfile->size;
        uint8_t* ch = new uint8_t[tex->mWidth];

        conv_data.db.reader->SetCurrentPos(static_cast<size_t>( img->packedfile->data->val));
        conv_data.db.reader->CopyAndAdvance(ch,tex->mWidth);

        tex->pcData = reinterpret_cast<aiTexel*>(ch);

        LogInfo("Reading embedded texture, original file was "+std::string(img->name));
    } else {
        name = aiString( img->name );
    }

    aiTextureType texture_type = aiTextureType_UNKNOWN;
    MTex::MapType map_type = tex->mapto;

    if (map_type & MTex::MapType_COL)
        texture_type = aiTextureType_DIFFUSE;
    else if (map_type & MTex::MapType_NORM) {
        if (tex->tex->imaflag & Tex::ImageFlags_NORMALMAP) {
            texture_type = aiTextureType_NORMALS;
        }
        else {
            texture_type = aiTextureType_HEIGHT;
        }
        out->AddProperty(&tex->norfac,1,AI_MATKEY_BUMPSCALING);
    }
    else if (map_type & MTex::MapType_COLSPEC)
        texture_type = aiTextureType_SPECULAR;
    else if (map_type & MTex::MapType_COLMIR)
        texture_type = aiTextureType_REFLECTION;
    //else if (map_type & MTex::MapType_REF)
    else if (map_type & MTex::MapType_SPEC)
        texture_type = aiTextureType_SHININESS;
    else if (map_type & MTex::MapType_EMIT)
        texture_type = aiTextureType_EMISSIVE;
    //else if (map_type & MTex::MapType_ALPHA)
    //else if (map_type & MTex::MapType_HAR)
    //else if (map_type & MTex::MapType_RAYMIRR)
    //else if (map_type & MTex::MapType_TRANSLU)
    else if (map_type & MTex::MapType_AMB)
        texture_type = aiTextureType_AMBIENT;
    else if (map_type & MTex::MapType_DISPLACE)
        texture_type = aiTextureType_DISPLACEMENT;
    //else if (map_type & MTex::MapType_WARP)

    out->AddProperty(&name,AI_MATKEY_TEXTURE(texture_type,
        conv_data.next_texture[texture_type]++));

}